

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *this,int __fd,void *__buf,size_t __n)

{
  format_specs *spec;
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  ssize_t extraout_RAX;
  void *pvVar4;
  char *data;
  char *__src;
  ulong __n_00;
  str_writer<char> local_38;
  
  __src = "false";
  if (__fd != 0) {
    __src = "true";
  }
  __n_00 = (ulong)(uint)__fd ^ 5;
  spec = this->specs_;
  if (spec != (format_specs *)0x0) {
    uVar3 = (ulong)(spec->super_core_format_specs).precision;
    local_38.size_ = __n_00;
    if (uVar3 < __n_00) {
      local_38.size_ = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_38.size_ = __n_00;
    }
    local_38.s = __src;
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                *)this,&spec->super_align_spec,&local_38);
    return extraout_RAX;
  }
  pbVar1 = (this->writer_).out_.container;
  sVar2 = pbVar1->size_;
  uVar3 = sVar2 + __n_00;
  if (pbVar1->capacity_ < uVar3) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar3);
  }
  pbVar1->size_ = uVar3;
  pvVar4 = memcpy(pbVar1->ptr_ + sVar2,__src,__n_00);
  return (ssize_t)pvVar4;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }